

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O0

void EC_POINT_clear_free(EC_POINT *point)

{
  void *unaff_retaddr;
  
  if (point != (EC_POINT *)0x0) {
    if (*(long *)(*(long *)point + 0x60) == 0) {
      if (*(long *)(*(long *)point + 0x58) != 0) {
        (**(code **)(*(long *)point + 0x58))(point);
      }
    }
    else {
      (**(code **)(*(long *)point + 0x60))(point);
    }
    CRYPTO_clear_free(unaff_retaddr,(size_t)point);
  }
  return;
}

Assistant:

void EC_POINT_clear_free(EC_POINT *point)
{
    if (!point)
        return;

    if (point->meth->point_clear_finish != 0)
        point->meth->point_clear_finish(point);
    else if (point->meth->point_finish != 0)
        point->meth->point_finish(point);
    CRYPTO_clear_free(point, sizeof(*point));
}